

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O3

void sep_upsample(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                 JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                 JDIMENSION out_rows_avail)

{
  jpeg_upsampler *pjVar1;
  uint uVar2;
  JDIMENSION JVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  JSAMPARRAY ppJVar7;
  JDIMENSION *pJVar8;
  jpeg_component_info *pjVar9;
  jpeg_upsampler *pjVar10;
  
  pjVar1 = cinfo->upsample;
  JVar3 = pjVar1[7].need_context_rows;
  iVar5 = cinfo->max_v_samp_factor;
  if (iVar5 <= (int)JVar3) {
    if (0 < cinfo->num_components) {
      pjVar9 = cinfo->comp_info;
      pjVar10 = pjVar1 + 1;
      lVar6 = 0;
      ppJVar7 = output_buf;
      pJVar8 = out_row_ctr;
      do {
        (*(&pjVar1[4].upsample)[lVar6])
                  (cinfo,(JSAMPIMAGE)pjVar9,
                   (JDIMENSION *)
                   (input_buf[lVar6] +
                   *(int *)((long)&pjVar1[8].start_pass + lVar6 * 4) * *in_row_group_ctr),
                   (JDIMENSION)pjVar10,ppJVar7,pJVar8,(JDIMENSION)in_row_group_ctr);
        lVar6 = lVar6 + 1;
        pjVar9 = pjVar9 + 1;
        pjVar10 = (jpeg_upsampler *)&pjVar10->upsample;
      } while (lVar6 < cinfo->num_components);
      iVar5 = cinfo->max_v_samp_factor;
    }
    pjVar1[7].need_context_rows = 0;
    JVar3 = 0;
  }
  uVar2 = iVar5 - JVar3;
  if (*(uint *)&pjVar1[7].field_0x14 <= iVar5 - JVar3) {
    uVar2 = *(uint *)&pjVar1[7].field_0x14;
  }
  uVar4 = out_rows_avail - *out_row_ctr;
  if (uVar2 < uVar4) {
    uVar4 = uVar2;
  }
  (*cinfo->cconvert->color_convert)
            (cinfo,(JSAMPIMAGE)(pjVar1 + 1),JVar3,output_buf + *out_row_ctr,uVar4);
  *out_row_ctr = *out_row_ctr + uVar4;
  *(uint *)&pjVar1[7].field_0x14 = *(int *)&pjVar1[7].field_0x14 - uVar4;
  iVar5 = uVar4 + pjVar1[7].need_context_rows;
  pjVar1[7].need_context_rows = iVar5;
  if (cinfo->max_v_samp_factor <= iVar5) {
    *in_row_group_ctr = *in_row_group_ctr + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
sep_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
             JDIMENSION *in_row_group_ctr, JDIMENSION in_row_groups_avail,
             JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
             JDIMENSION out_rows_avail)
{
  my_upsample_ptr upsample = (my_upsample_ptr)cinfo->upsample;
  int ci;
  jpeg_component_info *compptr;
  JDIMENSION num_rows;

  /* Fill the conversion buffer, if it's empty */
  if (upsample->next_row_out >= cinfo->max_v_samp_factor) {
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      /* Invoke per-component upsample method.  Notice we pass a POINTER
       * to color_buf[ci], so that fullsize_upsample can change it.
       */
      (*upsample->methods[ci]) (cinfo, compptr,
        input_buf[ci] + (*in_row_group_ctr * upsample->rowgroup_height[ci]),
        upsample->color_buf + ci);
    }
    upsample->next_row_out = 0;
  }

  /* Color-convert and emit rows */

  /* How many we have in the buffer: */
  num_rows = (JDIMENSION)(cinfo->max_v_samp_factor - upsample->next_row_out);
  /* Not more than the distance to the end of the image.  Need this test
   * in case the image height is not a multiple of max_v_samp_factor:
   */
  if (num_rows > upsample->rows_to_go)
    num_rows = upsample->rows_to_go;
  /* And not more than what the client can accept: */
  out_rows_avail -= *out_row_ctr;
  if (num_rows > out_rows_avail)
    num_rows = out_rows_avail;

  (*cinfo->cconvert->color_convert) (cinfo, upsample->color_buf,
                                     (JDIMENSION)upsample->next_row_out,
                                     output_buf + *out_row_ctr, (int)num_rows);

  /* Adjust counts */
  *out_row_ctr += num_rows;
  upsample->rows_to_go -= num_rows;
  upsample->next_row_out += num_rows;
  /* When the buffer is emptied, declare this input row group consumed */
  if (upsample->next_row_out >= cinfo->max_v_samp_factor)
    (*in_row_group_ctr)++;
}